

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O3

bool jessilib::apply_cpp_escape_sequences<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inout_string)

{
  char cVar1;
  bool bVar2;
  undefined1 *puVar3;
  char *in_RDX;
  char *extraout_RDX;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  pointer pcVar6;
  pointer pcVar7;
  ulong uVar8;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char,_std::char_traits<char>_> read_view;
  char *write_head;
  jessilib *local_40;
  char *local_38;
  pointer local_30;
  
  local_40 = (jessilib *)inout_string->_M_string_length;
  if (local_40 == (jessilib *)0x0) {
    bVar2 = true;
  }
  else {
    pcVar7 = (inout_string->_M_dataplus)._M_p;
    in_string._M_str = in_RDX;
    in_string._M_len = (size_t)pcVar7;
    local_38 = pcVar7;
    local_30 = pcVar7;
    dVar9 = decode_codepoint_utf8<char>(local_40,in_string);
    if (dVar9.units != 0) {
      do {
        in_string_00._M_str = (char *)dVar9.units;
        if (((uint)dVar9.codepoint < 0x5d) && (dVar9.codepoint == L'\\')) {
          in_string_00._M_len = local_38 + (long)in_string_00._M_str;
          local_40 = local_40 + -(long)in_string_00._M_str;
          local_38 = in_string_00._M_len;
          dVar9 = decode_codepoint_utf8<char>(local_40,in_string_00);
          puVar3 = cpp_escapes_main_tree<char>;
          uVar8 = 0x18;
          do {
            uVar4 = uVar8 >> 1;
            uVar5 = uVar4;
            if ((uint)*(char32_t *)((long)puVar3 + uVar4 * 2 * 8) < (uint)dVar9.codepoint) {
              uVar5 = ~uVar4 + uVar8;
              puVar3 = (undefined1 *)((long)puVar3 + (uVar4 * 2 + 2) * 8);
            }
            uVar8 = uVar5;
          } while (0 < (long)uVar5);
          if (((pointer_____offset_0x10___ *)puVar3 != &Jupiter::Thinker::typeinfo) &&
             (*(char32_t *)puVar3 == dVar9.codepoint)) {
            local_38 = local_38 + dVar9.units;
            local_40 = local_40 + -dVar9.units;
            cVar1 = (*(code *)*(pointer_____offset_0x10___ *)((long)puVar3 + 8))
                              (&local_30,&local_40);
            in_string_00._M_str = extraout_RDX;
            if (cVar1 != '\0') goto LAB_00136e6f;
          }
          pcVar6 = (inout_string->_M_dataplus)._M_p;
          uVar8 = (long)local_30 - (long)pcVar6;
          if (inout_string->_M_string_length < uVar8) goto LAB_00136eef;
          inout_string->_M_string_length = uVar8;
          pcVar6 = pcVar6 + uVar8;
          bVar2 = false;
          goto LAB_00136ebd;
        }
        do {
          *local_30 = *local_38;
          local_30 = local_30 + 1;
          local_38 = local_38 + 1;
          local_40 = local_40 + -1;
          in_string_00._M_str = in_string_00._M_str + -1;
        } while (in_string_00._M_str != (char *)0x0);
LAB_00136e6f:
        in_string_01._M_str = in_string_00._M_str;
        in_string_01._M_len = (size_t)local_38;
        dVar9 = decode_codepoint_utf8<char>(local_40,in_string_01);
        pcVar7 = local_30;
      } while (dVar9.units != 0);
    }
    pcVar6 = (inout_string->_M_dataplus)._M_p;
    uVar8 = (long)pcVar7 - (long)pcVar6;
    if (inout_string->_M_string_length < uVar8) {
LAB_00136eef:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar8);
    }
    inout_string->_M_string_length = uVar8;
    pcVar6 = pcVar6 + uVar8;
    bVar2 = true;
LAB_00136ebd:
    *pcVar6 = '\0';
  }
  return bVar2;
}

Assistant:

constexpr bool apply_cpp_escape_sequences(std::basic_string<CharT>& inout_string) {
	static_assert(is_sorted<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(), "Tree must be pre-sorted");
	static_assert(is_sorted<CharT, cpp_escapes_main_tree<CharT>, std::size(cpp_escapes_main_tree<CharT>)>(), "Tree must be pre-sorted");

	return apply_shrink_sequence_tree<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(inout_string);
}